

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::block_number_limits
               (NegativeTestContext *ctx)

{
  GLenum GVar1;
  bool bVar2;
  ShaderType shaderType;
  ProgramSources *pPVar3;
  GLenum in_ECX;
  GLenum in_R8D;
  ProgramSources local_530;
  ShaderSource local_460;
  ShaderSource local_438;
  ShaderSource local_410;
  ShaderSource local_3e8;
  ShaderSource local_3c0;
  ShaderSource local_398;
  ShaderSource local_370;
  ShaderSource local_348;
  ShaderSource local_320;
  ShaderSource local_2f8;
  ShaderSource local_2d0;
  ShaderSource local_2a8;
  ShaderSource local_280;
  ShaderSource local_258;
  ShaderSource local_230;
  ShaderSource local_208;
  undefined4 local_1dc;
  undefined1 local_1d8 [8];
  ProgramSources sources;
  string source;
  int maxSSBlocks;
  int local_bc;
  undefined1 local_b8 [4];
  int ndx;
  string tessEvalSource;
  string tessControlSource;
  undefined1 local_68 [8];
  string fragSource;
  string vertSource;
  GLenum glShaderTypes [6];
  NegativeTestContext *ctx_local;
  
  (anonymous_namespace)::genCommonSource_abi_cxx11_
            ((string *)((long)&fragSource.field_2 + 8),(_anonymous_namespace_ *)ctx,
             (NegativeTestContext *)0x8b31,in_ECX);
  (anonymous_namespace)::genCommonSource_abi_cxx11_
            ((string *)local_68,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8b30,in_ECX);
  (anonymous_namespace)::genCommonSource_abi_cxx11_
            ((string *)((long)&tessEvalSource.field_2 + 8),(_anonymous_namespace_ *)ctx,
             (NegativeTestContext *)0x8e88,in_ECX);
  (anonymous_namespace)::genCommonSource_abi_cxx11_
            ((string *)local_b8,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)0x8e87,in_ECX);
  for (local_bc = 0; local_bc < 6; local_bc = local_bc + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxSSBlocks,"maxShaderStorageBlocks: Exceed limits",
               (allocator<char> *)(source.field_2._M_local_buf + 0xf));
    NegativeTestContext::beginSection(ctx,(string *)&maxSSBlocks);
    std::__cxx11::string::~string((string *)&maxSSBlocks);
    std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
    shaderType = getGLUShaderType(glShaderTypes[(long)local_bc + -2]);
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      source.field_2._8_4_ = getMaxSSBlockSize(ctx,glShaderTypes[(long)local_bc + -2]);
      (anonymous_namespace)::genBlockSource_abi_cxx11_
                ((string *)&sources.separable,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(long)(source.field_2._8_4_ + 1),
                 (ulong)glShaderTypes[(long)local_bc + -2],in_R8D);
      glu::ProgramSources::ProgramSources((ProgramSources *)local_1d8);
      if (source.field_2._8_4_ == 0) {
        NegativeTestContext::endSection(ctx);
        local_1dc = 4;
      }
      else {
        GVar1 = glShaderTypes[(long)local_bc + -2];
        if (GVar1 == 0x8b30) {
          glu::VertexSource::VertexSource
                    ((VertexSource *)&local_258,(string *)((long)&fragSource.field_2 + 8));
          pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1d8,&local_258);
          glu::FragmentSource::FragmentSource
                    ((FragmentSource *)&local_280,(string *)&sources.separable);
          glu::ProgramSources::operator<<(pPVar3,&local_280);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_280);
          glu::VertexSource::~VertexSource((VertexSource *)&local_258);
        }
        else if (GVar1 == 0x8b31) {
          glu::VertexSource::VertexSource((VertexSource *)&local_208,(string *)&sources.separable);
          pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1d8,&local_208);
          glu::FragmentSource::FragmentSource((FragmentSource *)&local_230,(string *)local_68);
          glu::ProgramSources::operator<<(pPVar3,&local_230);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_230);
          glu::VertexSource::~VertexSource((VertexSource *)&local_208);
        }
        else if (GVar1 == 0x8dd9) {
          glu::VertexSource::VertexSource
                    ((VertexSource *)&local_3e8,(string *)((long)&fragSource.field_2 + 8));
          pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1d8,&local_3e8);
          glu::FragmentSource::FragmentSource((FragmentSource *)&local_410,(string *)local_68);
          pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_410);
          glu::GeometrySource::GeometrySource
                    ((GeometrySource *)&local_438,(string *)&sources.separable);
          glu::ProgramSources::operator<<(pPVar3,&local_438);
          glu::GeometrySource::~GeometrySource((GeometrySource *)&local_438);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_410);
          glu::VertexSource::~VertexSource((VertexSource *)&local_3e8);
        }
        else if (GVar1 == 0x8e87) {
          glu::VertexSource::VertexSource
                    ((VertexSource *)&local_348,(string *)((long)&fragSource.field_2 + 8));
          pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1d8,&local_348);
          glu::FragmentSource::FragmentSource((FragmentSource *)&local_370,(string *)local_68);
          pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_370);
          glu::TessellationControlSource::TessellationControlSource
                    ((TessellationControlSource *)&local_398,
                     (string *)((long)&tessEvalSource.field_2 + 8));
          pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_398);
          glu::TessellationEvaluationSource::TessellationEvaluationSource
                    ((TessellationEvaluationSource *)&local_3c0,(string *)&sources.separable);
          glu::ProgramSources::operator<<(pPVar3,&local_3c0);
          glu::TessellationEvaluationSource::~TessellationEvaluationSource
                    ((TessellationEvaluationSource *)&local_3c0);
          glu::TessellationControlSource::~TessellationControlSource
                    ((TessellationControlSource *)&local_398);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_370);
          glu::VertexSource::~VertexSource((VertexSource *)&local_348);
        }
        else if (GVar1 == 0x8e88) {
          glu::VertexSource::VertexSource
                    ((VertexSource *)&local_2a8,(string *)((long)&fragSource.field_2 + 8));
          pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1d8,&local_2a8);
          glu::FragmentSource::FragmentSource((FragmentSource *)&local_2d0,(string *)local_68);
          pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_2d0);
          glu::TessellationControlSource::TessellationControlSource
                    ((TessellationControlSource *)&local_2f8,(string *)&sources.separable);
          pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_2f8);
          glu::TessellationEvaluationSource::TessellationEvaluationSource
                    ((TessellationEvaluationSource *)&local_320,(string *)local_b8);
          glu::ProgramSources::operator<<(pPVar3,&local_320);
          glu::TessellationEvaluationSource::~TessellationEvaluationSource
                    ((TessellationEvaluationSource *)&local_320);
          glu::TessellationControlSource::~TessellationControlSource
                    ((TessellationControlSource *)&local_2f8);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_2d0);
          glu::VertexSource::~VertexSource((VertexSource *)&local_2a8);
        }
        else if (GVar1 == 0x91b9) {
          glu::ComputeSource::ComputeSource
                    ((ComputeSource *)&local_460,(string *)&sources.separable);
          glu::ProgramSources::operator<<((ProgramSources *)local_1d8,&local_460);
          glu::ComputeSource::~ComputeSource((ComputeSource *)&local_460);
        }
        glu::ProgramSources::ProgramSources(&local_530,(ProgramSources *)local_1d8);
        verifyProgram(ctx,&local_530);
        glu::ProgramSources::~ProgramSources(&local_530);
        NegativeTestContext::endSection(ctx);
        local_1dc = 0;
      }
      glu::ProgramSources::~ProgramSources((ProgramSources *)local_1d8);
      std::__cxx11::string::~string((string *)&sources.separable);
    }
    else {
      NegativeTestContext::endSection(ctx);
    }
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(tessEvalSource.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(fragSource.field_2._M_local_buf + 8));
  return;
}

Assistant:

void block_number_limits (NegativeTestContext& ctx)
{
	const glw::GLenum glShaderTypes[] =
	{
		GL_VERTEX_SHADER,
		GL_FRAGMENT_SHADER,
		GL_TESS_CONTROL_SHADER,
		GL_TESS_EVALUATION_SHADER,
		GL_GEOMETRY_SHADER,
		GL_COMPUTE_SHADER,
	};

	const std::string	vertSource			= genCommonSource(ctx, GL_VERTEX_SHADER);
	const std::string	fragSource			= genCommonSource(ctx, GL_FRAGMENT_SHADER);
	const std::string	tessControlSource	= genCommonSource(ctx, GL_TESS_CONTROL_SHADER);
	const std::string	tessEvalSource		= genCommonSource(ctx, GL_TESS_EVALUATION_SHADER);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(glShaderTypes); ndx++)
	{
		ctx.beginSection("maxShaderStorageBlocks: Exceed limits");

		if (!ctx.isShaderSupported(static_cast<glu::ShaderType>(getGLUShaderType(glShaderTypes[ndx]))))
		{
			ctx.endSection();
			continue;
		}

		int					maxSSBlocks			= getMaxSSBlockSize(ctx, glShaderTypes[ndx]);
		std::string			source				= genBlockSource(ctx, maxSSBlocks+1, glShaderTypes[ndx]);

		glu::ProgramSources sources;

		if (maxSSBlocks == 0)
		{
			ctx.endSection();
			continue;
		}

		switch (glShaderTypes[ndx])
		{
			case GL_VERTEX_SHADER:
				sources << glu::VertexSource(source)
						<< glu::FragmentSource(fragSource);
				break;

			case GL_FRAGMENT_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(source);
				break;

			case GL_TESS_CONTROL_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::TessellationControlSource(source)
						<< glu::TessellationEvaluationSource(tessEvalSource);
				break;

			case GL_TESS_EVALUATION_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::TessellationControlSource(tessControlSource)
						<< glu::TessellationEvaluationSource(source);
				break;

			case GL_GEOMETRY_SHADER:
				sources << glu::VertexSource(vertSource)
						<< glu::FragmentSource(fragSource)
						<< glu::GeometrySource(source);
				break;

			case GL_COMPUTE_SHADER:
				sources << glu::ComputeSource(source);
				break;

			default:
				DE_FATAL("Unknown shader type");
				break;
		}

		verifyProgram(ctx, sources);
		ctx.endSection();
	}
}